

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlp_context.cpp
# Opt level: O1

bool __thiscall r_exec::HLPContext::operator==(HLPContext *this,HLPContext *c)

{
  char cVar1;
  byte bVar2;
  bool bVar3;
  ushort uVar4;
  HLPContext lhs;
  HLPContext rhs;
  HLPContext local_f0;
  HLPContext local_d0;
  HLPContext local_b0;
  HLPContext local_90;
  HLPContext local_70;
  HLPContext local_50;
  
  operator*(&local_f0,this);
  operator*(&local_d0,c);
  cVar1 = r_code::Atom::operator!=
                    (local_f0.super__Context.code + (ulong)local_f0.super__Context.index * 4,
                     local_d0.super__Context.code + (ulong)local_d0.super__Context.index * 4);
  if (cVar1 == '\0') {
    cVar1 = r_code::Atom::isStructural();
    if (cVar1 != '\0') {
      bVar2 = r_code::Atom::getAtomCount();
      if (bVar2 == 0) {
        return bVar2 == 0;
      }
      uVar4 = 1;
      do {
        HLPContext(&local_70,local_f0.super__Context.code,local_f0.super__Context.index + uVar4,
                   (HLPOverlay *)local_f0.super__Context.overlay,STEM);
        operator*(&local_50,&local_70);
        HLPContext(&local_b0,local_d0.super__Context.code,local_d0.super__Context.index + uVar4,
                   (HLPOverlay *)local_d0.super__Context.overlay,STEM);
        operator*(&local_90,&local_b0);
        bVar3 = operator==(&local_50,&local_90);
        if (!bVar3) {
          return false;
        }
        bVar3 = uVar4 != bVar2;
        uVar4 = uVar4 + 1;
      } while (bVar3);
    }
    bVar3 = true;
  }
  else {
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

bool HLPContext::operator ==(const HLPContext &c) const
{
    HLPContext lhs = **this;
    HLPContext rhs = *c;

    if (lhs[0] != rhs[0]) { // both contexts point to an atom which is not a pointer.
        return false;
    }

    if (lhs[0].isStructural()) { // both are structural.
        uint16_t atom_count = lhs.getChildrenCount();

        for (uint16_t i = 1; i <= atom_count; ++i)
            if (*lhs.getChild(i) != *rhs.getChild(i)) {
                return false;
            }

        return true;
    }

    return true;
}